

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

void __thiscall tokenizer::read_current_file(tokenizer *this)

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  char *pcVar4;
  undefined1 local_30 [8];
  string line;
  tokenizer *this_local;
  
  line.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  this->line_number = 0;
  do {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&this->current_stream,(string *)local_30);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&this->current_word,"eof");
      add_token_to_stream(this,eof);
      std::__cxx11::string::~string((string *)local_30);
      return;
    }
    this->line_number = this->line_number + 1;
    this->position_number = 1;
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_30);
    this->line_char = pcVar4;
    while (*this->line_char != '\0') {
      if ((this->inComment & 1U) == 0) {
        if ((*this->line_char == ' ') || (*this->line_char == '\t')) {
          advance_to_next_character(this);
        }
        else {
          iVar2 = isalpha((int)*this->line_char);
          if ((iVar2 == 0) && (*this->line_char != '_')) {
            iVar2 = isdigit((int)*this->line_char);
            if (iVar2 == 0) {
              if ((*this->line_char == '/') && (this->line_char[1] == '/')) break;
              if ((*this->line_char == '/') && (this->line_char[1] == '*')) {
                read_comment(this);
              }
              else if ((*this->line_char == '-') &&
                      (iVar2 = isdigit((int)this->line_char[1]), iVar2 != 0)) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator+=(&this->current_word,'-');
                advance_to_next_character(this);
                read_number(this);
              }
              else if (((*this->line_char == '+') ||
                       ((((((*this->line_char == '-' || (*this->line_char == '*')) ||
                           (*this->line_char == '/')) ||
                          ((*this->line_char == '=' || (*this->line_char == '&')))) ||
                         ((*this->line_char == '|' ||
                          ((*this->line_char == '<' || (*this->line_char == '>')))))) ||
                        (*this->line_char == '!')))) || (*this->line_char == '%')) {
                read_symbol(this);
              }
              else if (*this->line_char == '\"') {
                this->line_char = this->line_char + 1;
                read_string(this);
              }
              else if (*this->line_char == '{') {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator+=(&this->current_word,*this->line_char);
                add_token_to_stream(this,left_curly_bracket);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&this->current_word,"");
                advance_to_next_character(this);
              }
              else if (*this->line_char == '}') {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator+=(&this->current_word,*this->line_char);
                add_token_to_stream(this,right_curly_bracket);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&this->current_word,"");
                advance_to_next_character(this);
              }
              else if (*this->line_char == '(') {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator+=(&this->current_word,*this->line_char);
                add_token_to_stream(this,left_round_bracket);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&this->current_word,"");
                advance_to_next_character(this);
              }
              else if (*this->line_char == ')') {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator+=(&this->current_word,*this->line_char);
                add_token_to_stream(this,right_round_bracket);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&this->current_word,"");
                advance_to_next_character(this);
              }
              else if (*this->line_char == ';') {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator+=(&this->current_word,*this->line_char);
                add_token_to_stream(this,semicolon);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&this->current_word,"");
                advance_to_next_character(this);
              }
              else {
                read_invalid_token(this);
              }
            }
            else {
              read_number(this);
            }
          }
          else {
            read_identifier(this);
          }
        }
      }
      else {
        continue_to_read_comment(this);
      }
    }
  } while( true );
}

Assistant:

void tokenizer::read_current_file() {
    string line;

    line_number = 0;

    while(getline(current_stream, line)) {

        line_number++;
        position_number = 1;

        line_char = line.c_str();

        while(*line_char != '\0') {
            if(inComment) {
                this->continue_to_read_comment();
            }
            else if(*line_char == ' ' || *line_char == '\t') {
                this->advance_to_next_character();
            }
            else if(isalpha(*line_char) || *line_char == '_') {
                this->read_identifier();
            }
            else if(isdigit(*line_char)) {
                this->read_number();
            }
            else if(*line_char == '/' && *(line_char + 1) == '/') {
                break;
            }
            else if(*line_char == '/' && *(line_char + 1) == '*') {
                this->read_comment();
            }
            else if(*line_char == '-' && isdigit(*(line_char + 1))) {
                current_word += '-';
                this->advance_to_next_character();
                this->read_number();
            }
            else if(*line_char == '+' || *line_char == '-' || *line_char == '*'
            || *line_char == '/' || *line_char == '=' || *line_char == '&'
            || *line_char == '|' || *line_char == '<' || *line_char == '>'
            || *line_char == '!' || *line_char == '%') {
                this->read_symbol();
            }
            else if(*line_char == '"') {
                line_char++;
                this->read_string();
            }
            else if(*line_char == '{') {
                current_word += *line_char;
                this->add_token_to_stream(Token_Type::left_curly_bracket);
                current_word = "";
                this->advance_to_next_character();
            }
            else if(*line_char == '}') {
                current_word += *line_char;
                this->add_token_to_stream(Token_Type::right_curly_bracket);
                current_word = "";
                this->advance_to_next_character();
            }
            else if(*line_char == '(') {
                current_word += *line_char;
                this->add_token_to_stream(Token_Type::left_round_bracket);
                current_word = "";
                this->advance_to_next_character();
            }
            else if(*line_char == ')') {
                current_word += *line_char;
                this->add_token_to_stream(Token_Type::right_round_bracket);
                current_word = "";
                this->advance_to_next_character();
            }
            else if(*line_char == ';') {
                current_word += *line_char;
                this->add_token_to_stream(Token_Type::semicolon);
                current_word = "";
                this->advance_to_next_character();
            }
            else {
                this->read_invalid_token();
            }
        }
    }
    current_word = "eof";
    this->add_token_to_stream(Token_Type::eof);
}